

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

bool __thiscall UniValue::setNumStr(UniValue *this,string *val_)

{
  char *raw;
  jtokentype jVar1;
  uint consumed;
  string tokenVal;
  uint local_3c;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  raw = (val_->_M_dataplus)._M_p;
  jVar1 = getJsonToken(&local_38,&local_3c,raw,raw + val_->_M_string_length);
  std::__cxx11::string::~string((string *)&local_38);
  if (jVar1 == JTOK_NUMBER) {
    clear(this);
    this->typ = VNUM;
    std::__cxx11::string::_M_assign((string *)&this->val);
  }
  return jVar1 == JTOK_NUMBER;
}

Assistant:

bool UniValue::setNumStr(const std::string& val_)
{
    if (!validNumStr(val_))
        return false;

    clear();
    typ = VNUM;
    val = val_;
    return true;
}